

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

QFunctionsDiscrete * __thiscall
AlphaVectorPlanning::Prune(AlphaVectorPlanning *this,QFunctionsDiscrete *Q)

{
  size_type sVar1;
  reference this_00;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *in_RDX;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_RSI;
  allocator_type *in_RDI;
  Index a;
  size_t nrAlphas;
  QFunctionsDiscrete *Q1;
  ValueFunctionPOMDPDiscrete *in_stack_000000c0;
  AlphaVectorPlanning *in_stack_000000c8;
  allocator_type *__a;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *this_01;
  uint local_3c;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  local_1a;
  
  local_1a.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_1_ = 0;
  __a = in_RDI;
  local_1a.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = in_RDX;
  sVar1 = std::
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ::size(in_RDX);
  this_01 = &local_1a;
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x90b3c3);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(this_01,sVar1,__a);
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::~allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x90b3e3);
  for (local_3c = 0;
      sVar1 = std::
              vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
              ::size((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                      *)local_1a.
                        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                        ._M_impl.super__Vector_impl_data._2_8_), local_3c != sVar1;
      local_3c = local_3c + 1) {
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::operator[]((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  *)local_1a.
                    super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                    ._M_impl.super__Vector_impl_data._2_8_,(ulong)local_3c);
    Prune(in_stack_000000c8,in_stack_000000c0);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::operator[]((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  *)__a,(ulong)local_3c);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator=
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)__a,in_RSI);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)__a);
    this_00 = std::
              vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
              ::operator[]((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                            *)__a,(ulong)local_3c);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(this_00);
  }
  return (QFunctionsDiscrete *)in_RDI;
}

Assistant:

QFunctionsDiscrete AlphaVectorPlanning::Prune(const QFunctionsDiscrete &Q) const
{
    QFunctionsDiscrete Q1(Q.size());
    size_t nrAlphas=0;

#if 0
    cout << "Calling Cassandra's pomdp-tools for pruning a Q-value function of size <";
    for(Index a=0;a!=Q.size();++a)
        cout << " " << Q[a].size();
    cout << " >" << endl;
#endif

    for(Index a=0;a!=Q.size();++a)
    {

#if DEBUG_AlphaVectorPlanning_Prune
//        cout << "AlphaVectorPlanning::Prune for action " << a << ": " << Q.size() << " vectors" << endl;
#endif
        Q1[a]=Prune(Q[a]);
        nrAlphas+=Q1[a].size();
        
    }

#if DEBUG_AlphaVectorPlanning_Prune
        cout << "AlphaVectorPlanning::Prune for action " << a << ": reduced "
             << Q[a].size() << " to " 
             << Q1[a].size()
             << " (total #vectors: " << nrAlphas << ")" << endl;
#endif

    return(Q1);
}